

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

string * __thiscall Node::label_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong *puVar8;
  code *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint __len;
  string llvmTemporaryString;
  string __str;
  raw_string_ostream llvmStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  code *local_78;
  ulong local_70;
  ulong local_68;
  long lStack_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 *local_38;
  
  uVar3 = this->id_;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00114e80;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00114e80;
      }
      if (uVar7 < 10000) goto LAB_00114e80;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00114e80:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_b8._M_dataplus._M_p + (uVar3 >> 0x1f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x11f031);
  paVar2 = &local_d8.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_d8.field_2._M_allocated_capacity = *puVar8;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar8;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  pcVar9 = (code *)(plVar5 + 2);
  if ((code *)*plVar5 == pcVar9) {
    local_68 = *(ulong *)pcVar9;
    lStack_60 = plVar5[3];
    local_78 = (code *)&local_68;
  }
  else {
    local_68 = *(ulong *)pcVar9;
    local_78 = (code *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)pcVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  nodeTypeToString_abi_cxx11_(&local_98,this->nodeType_);
  uVar10 = 0xf;
  if (local_78 != (code *)&local_68) {
    uVar10 = local_68;
  }
  if (uVar10 < local_98._M_string_length + local_70) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar11 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_70 <= (ulong)uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      goto LAB_00114fdc;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
LAB_00114fdc:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar11 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != (code *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (this->llvmInstruction_ != (Instruction *)0x0) {
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity =
         local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_70 = local_70 & 0xffffffff00000000;
    local_50 = 0;
    local_48 = 0;
    local_40 = 1;
    local_68 = 0;
    lStack_60 = 0;
    local_58 = 0;
    local_78 = memmove;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    local_38 = (undefined1 *)&local_d8;
    llvm::raw_ostream::SetUnbuffered((raw_ostream *)&local_78);
    llvm::Value::print((raw_ostream *)this->llvmInstruction_,SUB81((raw_ostream *)&local_78,0));
    std::operator+(&local_b8,"\n",&local_d8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Node::label() const {
    std::string label_ = "[label=\"<" + std::to_string(this->id()) + "> " +
                         nodeTypeToString(this->getType());
    if (!isArtificial()) {
        string llvmTemporaryString;
        raw_string_ostream llvmStream(llvmTemporaryString);
        llvmInstruction_->print(llvmStream);
        label_ += "\n" + llvmTemporaryString;
    }
    label_ += " \"]";
    return label_;
}